

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

void __thiscall HMISong::HMISong(HMISong *this,FileReader *reader,EMidiDevice type,char *args)

{
  int len_00;
  int iVar1;
  long lVar2;
  BYTE *pBVar3;
  undefined4 extraout_var;
  int len;
  char *args_local;
  EMidiDevice type_local;
  FileReader *reader_local;
  HMISong *this_local;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__HMISong_009f0678;
  this->MusHeader = (BYTE *)0x0;
  this->Tracks = (TrackInfo *)0x0;
  NoteOffQueue::NoteOffQueue(&this->NoteOffs);
  lVar2 = FileReader::GetLength(reader);
  len_00 = (int)lVar2;
  if (0xff < len_00) {
    pBVar3 = (BYTE *)operator_new__((long)len_00);
    this->MusHeader = pBVar3;
    this->SongLen = len_00;
    this->NumTracks = 0;
    iVar1 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                      (reader,this->MusHeader,(long)len_00);
    if (CONCAT44(extraout_var,iVar1) == (long)len_00) {
      iVar1 = memcmp(this->MusHeader,"HMI-MIDISONG061595",0x13);
      if (iVar1 == 0) {
        SetupForHMI(this,len_00);
      }
      else if ((*(int *)this->MusHeader == 0x4d494d48) &&
              (*(int *)(this->MusHeader + 4) == 0x50494449)) {
        SetupForHMP(this,len_00);
      }
    }
  }
  return;
}

Assistant:

HMISong::HMISong (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), Tracks(0)
{
#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif
    int len = reader.GetLength();
	if (len < 0x100)
	{ // Way too small to be HMI.
		return;
	}
	MusHeader = new BYTE[len];
	SongLen = len;
	NumTracks = 0;
	if (reader.Read(MusHeader, len) != len)
		return;

	// Do some validation of the MIDI file
	if (memcmp(MusHeader, HMI_SONG_MAGIC, sizeof(HMI_SONG_MAGIC)) == 0)
	{
		SetupForHMI(len);
	}
	else if (((DWORD *)MusHeader)[0] == MAKE_ID('H','M','I','M') &&
			 ((DWORD *)MusHeader)[1] == MAKE_ID('I','D','I','P'))
	{
		SetupForHMP(len);
	}
}